

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

string * __thiscall
slang::DiagnosticEngine::formatMessage_abi_cxx11_(DiagnosticEngine *this,Diagnostic *diag)

{
  bool bVar1;
  element_type *peVar2;
  long in_RDX;
  dynamic_format_arg_store<fmt::v11::context> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  string *in_RDI;
  string_view sVar3;
  basic_format_args<fmt::v11::context> bVar4;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
  *arg;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  *__range1_1;
  dynamic_format_arg_store<fmt::v11::context> args;
  type *formatter;
  type *key;
  iterator __end1;
  iterator __begin1;
  FormatterMap *__range1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe98;
  dynamic_format_arg_store<fmt::v11::context> *in_stack_fffffffffffffea0;
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  DiagnosticEngine *in_stack_fffffffffffffee8;
  DiagCode in_stack_fffffffffffffef4;
  __normal_iterator<const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_*,_std::vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>_>
  local_c8;
  long local_c0;
  type *local_80;
  type *local_78;
  reference local_70;
  iterator local_68;
  iterator local_58;
  char **local_48;
  allocator<char> local_2d;
  undefined4 local_2c;
  string_view local_28;
  long local_18;
  
  local_18 = in_RDX;
  bVar1 = std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::empty(in_stack_fffffffffffffeb0);
  if (bVar1) {
    local_2c = *(undefined4 *)(local_18 + 0x58);
    local_28 = getMessage(in_stack_fffffffffffffee8,in_stack_fffffffffffffef4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffee0,in_RSI,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_2d);
  }
  else {
    bVar1 = boost::unordered::
            unordered_flat_map<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
            ::empty((unordered_flat_map<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                     *)0x84a886);
    if (bVar1) {
      boost::unordered::
      unordered_flat_map<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
      ::operator=((unordered_flat_map<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                   *)in_stack_fffffffffffffea0,
                  (unordered_flat_map<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                   *)in_stack_fffffffffffffe98);
    }
    local_48 = &in_RSI[0x14]._M_str;
    local_58 = boost::unordered::
               unordered_flat_map<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
               ::begin((unordered_flat_map<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                        *)0x84a8c4);
    local_68 = boost::unordered::
               unordered_flat_map<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
               ::end((unordered_flat_map<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                      *)0x84a8e1);
    while (bVar1 = boost::unordered::detail::foa::operator!=
                             ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffea0,
                              (table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffe98), bVar1) {
      local_70 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              *)0x84a919);
      local_78 = std::get<0ul,std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>
                           ((pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>
                             *)0x84a92e);
      local_80 = std::get<1ul,std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>
                           ((pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>
                             *)0x84a943);
      peVar2 = std::
               __shared_ptr_access<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x84a958);
      (*peVar2->_vptr_DiagArgFormatter[2])(peVar2,local_18);
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)in_stack_fffffffffffffea0);
    }
    ::fmt::v11::dynamic_format_arg_store<fmt::v11::context>::dynamic_format_arg_store
              (in_stack_fffffffffffffea0);
    local_c0 = local_18;
    local_c8._M_current =
         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
          *)std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::begin((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                     *)in_stack_fffffffffffffe98);
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::end((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           *)in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_*,_std::vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>_>
                             ((__normal_iterator<const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_*,_std::vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>_>
                               *)in_stack_fffffffffffffea0,
                              (__normal_iterator<const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_*,_std::vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>_>
                               *)in_stack_fffffffffffffe98), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_*,_std::vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>_>
      ::operator*(&local_c8);
      std::
      visit<slang::DiagnosticEngine::formatMessage[abi:cxx11](slang::Diagnostic_const&)const::__0,std::variant<std::__cxx11::string,long,unsigned_long,char,slang::ConstantValue,std::pair<std::type_index,std::any>>const&>
                ((anon_class_16_2_3fddba98 *)in_stack_fffffffffffffea0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                  *)in_stack_fffffffffffffe98);
      __gnu_cxx::
      __normal_iterator<const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_*,_std::vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>_>
      ::operator++(&local_c8);
    }
    sVar3 = getMessage(in_stack_fffffffffffffee8,*(DiagCode *)(local_18 + 0x58));
    this_00 = (dynamic_format_arg_store<fmt::v11::context> *)sVar3._M_str;
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    bVar4 = ::fmt::v11::dynamic_format_arg_store::operator_cast_to_basic_format_args(this_00);
    ::fmt::v11::vformat_abi_cxx11_((string_view)__begin1,(format_args)__end1);
    ::fmt::v11::dynamic_format_arg_store<fmt::v11::context>::~dynamic_format_arg_store
              ((dynamic_format_arg_store<fmt::v11::context> *)bVar4.field_1.values_);
  }
  return in_RDI;
}

Assistant:

std::string DiagnosticEngine::formatMessage(const Diagnostic& diag) const {
    // If we have no arguments, the format string is the entire message.
    if (diag.args.empty())
        return std::string(getMessage(diag.code));

    // Let each formatter have a look at the diagnostic before we begin.
    if (formatters.empty())
        formatters = defaultFormatters;

    for (auto& [key, formatter] : formatters)
        formatter->startMessage(diag);

    // Dynamically build up the list of arguments to pass to the formatting routines.
    fmt::dynamic_format_arg_store<fmt::format_context> args;
    for (auto& arg : diag.args) {
        // Unwrap the argument type (stored as a variant).
        std::visit(
            [&](auto&& t) {
                // If the argument is a pointer, the fmtlib API needs it unwrapped into a reference.
                using T = std::decay_t<decltype(t)>;
                if constexpr (std::is_same_v<Diagnostic::CustomArgType, T>) {
                    if (auto it = formatters.find(t.first); it != formatters.end())
                        args.push_back(it->second->format(t.second));
                    else
                        SLANG_THROW(std::runtime_error("No diagnostic formatter for type"));
                }
                else if constexpr (std::is_same_v<ConstantValue, T>) {
                    if (t.isReal())
                        args.push_back(double(t.real()));
                    else if (t.isShortReal())
                        args.push_back(float(t.shortReal()));
                    else
                        args.push_back(t.toString());
                }
                else {
                    args.push_back(t);
                }
            },
            arg);
    }

    return fmt::vformat(getMessage(diag.code), args);
}